

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O1

void __thiscall player_t::Serialize(player_t *this,FSerializer *arc)

{
  userinfo_t *info;
  FSerializer *pFVar1;
  FString skinname;
  DObject *v;
  FString local_40;
  AWeapon *local_38;
  
  local_40.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  pFVar1 = Serialize<PClassActor>(arc,"class",(PClassActor **)&this->cls,(PClassActor **)0x0);
  local_38 = (AWeapon *)this->mo;
  ::Serialize(pFVar1,"mo",(DObject **)&local_38,(DObject **)0x0,(bool *)0x0);
  this->mo = (APlayerPawn *)local_38;
  ::Serialize(pFVar1,"camera",(DObject **)&this->camera,(DObject **)0x0,(bool *)0x0);
  pFVar1 = ::Serialize(pFVar1,"playerstate",&this->playerstate,(uint8_t *)0x0);
  ::Serialize(pFVar1,"cmd",&this->cmd,(ticcmd_t *)0x0);
  info = &this->userinfo;
  if (arc->r == (FReader *)0x0) {
    WriteUserInfo(arc,info);
  }
  else {
    ReadUserInfo(arc,info,&local_40);
  }
  pFVar1 = ::Serialize(arc,"desiredfov",&this->DesiredFOV,(float *)0x0);
  pFVar1 = ::Serialize(pFVar1,"fov",&this->FOV,(float *)0x0);
  pFVar1 = ::Serialize(pFVar1,"viewz",&this->viewz,(double *)0x0);
  pFVar1 = ::Serialize(pFVar1,"viewheight",&this->viewheight,(double *)0x0);
  pFVar1 = ::Serialize(pFVar1,"deltaviewheight",&this->deltaviewheight,(double *)0x0);
  pFVar1 = ::Serialize(pFVar1,"bob",&this->bob,(double *)0x0);
  pFVar1 = FSerializer::Array<double>(pFVar1,"vel",&(this->Vel).X,(double *)0x0,2,true);
  pFVar1 = ::Serialize(pFVar1,"centering",&this->centering,(bool *)0x0);
  pFVar1 = ::Serialize(pFVar1,"health",&this->health,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"inventorytics",&this->inventorytics,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"fragcount",&this->fragcount,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"spreecount",&this->spreecount,(uint8_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"multicount",&this->multicount,(uint8_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"lastkilltime",&this->lastkilltime,(int32_t *)0x0);
  local_38 = this->ReadyWeapon;
  ::Serialize(pFVar1,"readyweapon",(DObject **)&local_38,(DObject **)0x0,(bool *)0x0);
  this->ReadyWeapon = local_38;
  local_38 = this->PendingWeapon;
  ::Serialize(pFVar1,"pendingweapon",(DObject **)&local_38,(DObject **)0x0,(bool *)0x0);
  this->PendingWeapon = local_38;
  pFVar1 = ::Serialize(pFVar1,"cheats",&this->cheats,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"refire",&this->refire,(int16_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"inconsistant",&this->inconsistant,(int16_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"killcount",&this->killcount,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"itemcount",&this->itemcount,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"secretcount",&this->secretcount,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"damagecount",&this->damagecount,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"bonuscount",&this->bonuscount,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"hazardcount",&this->hazardcount,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"poisoncount",&this->poisoncount,(int32_t *)0x0);
  ::Serialize(pFVar1,"poisoner",(DObject **)&this->poisoner,(DObject **)0x0,(bool *)0x0);
  ::Serialize(pFVar1,"attacker",(DObject **)&this->attacker,(DObject **)0x0,(bool *)0x0);
  pFVar1 = ::Serialize(pFVar1,"extralight",&this->extralight,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"fixedcolormap",&this->fixedcolormap,(int16_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"fixedlightlevel",&this->fixedlightlevel,(int16_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"morphTics",&this->morphTics,(int32_t *)0x0);
  pFVar1 = Serialize<PClassActor>
                     (pFVar1,"morphedplayerclass",(PClassActor **)&this->MorphedPlayerClass,
                      (PClassActor **)0x0);
  pFVar1 = ::Serialize(pFVar1,"morphstyle",&this->MorphStyle,(int32_t *)0x0);
  pFVar1 = Serialize<PClassActor>(pFVar1,"morphexitflash",&this->MorphExitFlash,(PClassActor **)0x0)
  ;
  ::Serialize(pFVar1,"premorphweapon",(DObject **)&this->PremorphWeapon,(DObject **)0x0,(bool *)0x0)
  ;
  pFVar1 = ::Serialize(pFVar1,"chickenpeck",&this->chickenPeck,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"jumptics",&this->jumpTics,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"respawntime",&this->respawn_time,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"airfinished",&this->air_finished,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"turnticks",&this->turnticks,(uint8_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"oldbuttons",&this->oldbuttons,(uint32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"hazardtype",&this->hazardtype,(FName *)0x0);
  pFVar1 = ::Serialize(pFVar1,"hazardinterval",&this->hazardinterval,(int32_t *)0x0);
  ::Serialize(pFVar1,"bot",(DObject **)&this->Bot,(DObject **)0x0,(bool *)0x0);
  pFVar1 = ::Serialize(pFVar1,"blendr",&this->BlendR,(float *)0x0);
  pFVar1 = ::Serialize(pFVar1,"blendg",&this->BlendG,(float *)0x0);
  pFVar1 = ::Serialize(pFVar1,"blendb",&this->BlendB,(float *)0x0);
  pFVar1 = ::Serialize(pFVar1,"blenda",&this->BlendA,(float *)0x0);
  pFVar1 = ::Serialize(pFVar1,"weaponstate",&this->WeaponState,(uint16_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"logtext",&this->LogText,(FString *)0x0);
  ::Serialize(pFVar1,"conversionnpc",(DObject **)&this->ConversationNPC,(DObject **)0x0,(bool *)0x0)
  ;
  ::Serialize(pFVar1,"conversionpc",(DObject **)&this->ConversationPC,(DObject **)0x0,(bool *)0x0);
  pFVar1 = ::Serialize(pFVar1,"conversionnpcangle",&(this->ConversationNPCAngle).Degrees,
                       (double *)0x0);
  pFVar1 = ::Serialize(pFVar1,"conversionfacetalker",&this->ConversationFaceTalker,(bool *)0x0);
  pFVar1 = FSerializer::Array<int>(pFVar1,"frags",this->frags,8,false);
  ::Serialize(pFVar1,"psprites",(DObject **)&this->psprites,(DObject **)0x0,(bool *)0x0);
  pFVar1 = ::Serialize(pFVar1,"currentplayerclass",&this->CurrentPlayerClass,(uint8_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"crouchfactor",&this->crouchfactor,(double *)0x0);
  pFVar1 = ::Serialize(pFVar1,"crouching",&this->crouching,(int8_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"crouchdir",&this->crouchdir,(int8_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"crouchviewdelta",&this->crouchviewdelta,(double *)0x0);
  pFVar1 = ::Serialize(pFVar1,"original_cmd",&this->original_cmd,(usercmd_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"original_oldbuttons",&this->original_oldbuttons,(uint32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"poisontype",&this->poisontype,(FName *)0x0);
  pFVar1 = ::Serialize(pFVar1,"poisonpaintype",&this->poisonpaintype,(FName *)0x0);
  pFVar1 = ::Serialize(pFVar1,"timefreezer",&this->timefreezer,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"settings_controller",&this->settings_controller,(bool *)0x0);
  pFVar1 = ::Serialize(pFVar1,"onground",&this->onground,(bool *)0x0);
  ::Serialize(pFVar1,"musinfoactor",(DObject **)&this->MUSINFOactor,(DObject **)0x0,(bool *)0x0);
  ::Serialize(pFVar1,"musinfotics",&this->MUSINFOtics,(int8_t *)0x0);
  if (arc->w != (FWriter *)0x0) {
    this->oldbuttons = 0xffffffff;
    this->original_oldbuttons = 0xffffffff;
  }
  if (((FNullStringData *)(local_40.Chars + -0xc))->Len != 0) {
    userinfo_t::SkinChanged(info,local_40.Chars,(uint)this->CurrentPlayerClass);
  }
  FString::~FString(&local_40);
  return;
}

Assistant:

void player_t::Serialize(FSerializer &arc)
{
	FString skinname;

	arc("class", cls)
		("mo", mo)
		("camera", camera)
		("playerstate", playerstate)
		("cmd", cmd);

	if (arc.isReading())
	{
		ReadUserInfo(arc, userinfo, skinname);
	}
	else
	{
		WriteUserInfo(arc, userinfo);
	}

	arc("desiredfov", DesiredFOV)
		("fov", FOV)
		("viewz", viewz)
		("viewheight", viewheight)
		("deltaviewheight", deltaviewheight)
		("bob", bob)
		("vel", Vel)
		("centering", centering)
		("health", health)
		("inventorytics", inventorytics)
		("fragcount", fragcount)
		("spreecount", spreecount)
		("multicount", multicount)
		("lastkilltime", lastkilltime)
		("readyweapon", ReadyWeapon)
		("pendingweapon", PendingWeapon)
		("cheats", cheats)
		("refire", refire)
		("inconsistant", inconsistant)
		("killcount", killcount)
		("itemcount", itemcount)
		("secretcount", secretcount)
		("damagecount", damagecount)
		("bonuscount", bonuscount)
		("hazardcount", hazardcount)
		("poisoncount", poisoncount)
		("poisoner", poisoner)
		("attacker", attacker)
		("extralight", extralight)
		("fixedcolormap", fixedcolormap)
		("fixedlightlevel", fixedlightlevel)
		("morphTics", morphTics)
		("morphedplayerclass", MorphedPlayerClass)
		("morphstyle", MorphStyle)
		("morphexitflash", MorphExitFlash)
		("premorphweapon", PremorphWeapon)
		("chickenpeck", chickenPeck)
		("jumptics", jumpTics)
		("respawntime", respawn_time)
		("airfinished", air_finished)
		("turnticks", turnticks)
		("oldbuttons", oldbuttons)
		("hazardtype", hazardtype)
		("hazardinterval", hazardinterval)
		("bot", Bot)
		("blendr", BlendR)
		("blendg", BlendG)
		("blendb", BlendB)
		("blenda", BlendA)
		("weaponstate", WeaponState)
		("logtext", LogText)
		("conversionnpc", ConversationNPC)
		("conversionpc", ConversationPC)
		("conversionnpcangle", ConversationNPCAngle)
		("conversionfacetalker", ConversationFaceTalker)
		.Array("frags", frags, MAXPLAYERS)
		("psprites", psprites)
		("currentplayerclass", CurrentPlayerClass)
		("crouchfactor", crouchfactor)
		("crouching", crouching)
		("crouchdir", crouchdir)
		("crouchviewdelta", crouchviewdelta)
		("original_cmd", original_cmd)
		("original_oldbuttons", original_oldbuttons)
		("poisontype", poisontype)
		("poisonpaintype", poisonpaintype)
		("timefreezer", timefreezer)
		("settings_controller", settings_controller)
		("onground", onground)
		("musinfoactor", MUSINFOactor)
		("musinfotics", MUSINFOtics);

	if (arc.isWriting ())
	{
		// If the player reloaded because they pressed +use after dying, we
		// don't want +use to still be down after the game is loaded.
		oldbuttons = ~0;
		original_oldbuttons = ~0;
	}
	if (skinname.IsNotEmpty())
	{
		userinfo.SkinChanged(skinname, CurrentPlayerClass);
	}
}